

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t art_serialize(art_t *art,char *buf)

{
  _Bool _Var1;
  art_ref_t *__s;
  size_t sVar2;
  art_ref_t *in_RSI;
  art_t *in_RDI;
  size_t size;
  art_typecode_t t;
  size_t align_bytes;
  char *initial_buf;
  byte local_29;
  void *local_18;
  size_t local_8;
  
  if (in_RSI == (art_ref_t *)0x0) {
    local_8 = 0;
  }
  else {
    _Var1 = art_is_shrunken(in_RDI);
    if (_Var1) {
      *in_RSI = in_RDI->root;
      memcpy(in_RSI + 1,in_RDI->capacities,0x30);
      __s = in_RSI + 7;
      sVar2 = ((long)__s + (7 - (long)in_RSI) & 0xfffffffffffffff8U) - ((long)__s - (long)in_RSI);
      memset(__s,0,sVar2);
      local_18 = (void *)(sVar2 + (long)__s);
      for (local_29 = 1; local_29 < 6; local_29 = local_29 + 1) {
        if (in_RDI->capacities[local_29] != 0) {
          sVar2 = in_RDI->capacities[local_29] * ART_NODE_SIZES[local_29];
          memcpy(local_18,in_RDI->nodes[local_29],sVar2);
          local_18 = (void *)(sVar2 + (long)local_18);
        }
      }
      local_8 = (long)local_18 - (long)in_RSI;
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t art_serialize(const art_t *art, char *buf) {
    if (buf == NULL) {
        return 0;
    }
    if (!art_is_shrunken(art)) {
        return 0;
    }
    const char *initial_buf = buf;

    // Root.
    memcpy(buf, &art->root, sizeof(art->root));
    buf += sizeof(art->root);

    // Node counts.
    memcpy(buf, art->capacities, sizeof(art->capacities));
    buf += sizeof(art->capacities);

    // Alignment for leaves. The rest of the nodes are aligned the same way.
    size_t align_bytes =
        CROARING_ART_ALIGN_SIZE_RELATIVE(buf, initial_buf, alignof(art_leaf_t));
    memset(buf, 0, align_bytes);
    buf += align_bytes;

    for (art_typecode_t t = CROARING_ART_MIN_TYPE; t <= CROARING_ART_MAX_TYPE;
         ++t) {
        if (art->capacities[t] > 0) {
            size_t size = art->capacities[t] * ART_NODE_SIZES[t];
            memcpy(buf, art->nodes[t], size);
            buf += size;
        }
    }

    return buf - initial_buf;
}